

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O0

void __thiscall mahjong::MinipointCounter::computePair(MinipointCounter *this)

{
  WiningHand *this_00;
  bool bVar1;
  Tile TVar2;
  reference pPVar3;
  undefined1 local_40 [8];
  Pair it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *__range1;
  MinipointCounter *this_local;
  
  this_00 = this->hand;
  __end1 = std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::begin(&this_00->pairs);
  it.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::end(&this_00->pairs);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_mahjong::Pair_*,_std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>_>
                                     *)&it.tiles.
                                        super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)
  {
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_mahjong::Pair_*,_std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>_>
             ::operator*(&__end1);
    Pair::Pair((Pair *)local_40,pPVar3);
    bVar1 = Pair::isDragons((Pair *)local_40);
    if (bVar1) {
      this->point = this->point + 2;
    }
    else {
      TVar2 = WiningState::seatWind(this->state);
      bVar1 = Pair::isContain((Pair *)local_40,TVar2);
      if (bVar1) {
        this->point = this->point + 2;
      }
      TVar2 = WiningState::roundWind(this->state);
      bVar1 = Pair::isContain((Pair *)local_40,TVar2);
      if (bVar1) {
        this->point = this->point + 2;
      }
    }
    Pair::~Pair((Pair *)local_40);
    __gnu_cxx::
    __normal_iterator<const_mahjong::Pair_*,_std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void MinipointCounter::computePair()
{
	for (auto it : hand.pairs)
	{
		if (it.isDragons())
		{
			point += 2;
		}
		else
		{
			if (it.isContain(state.seatWind()))
			{
				point += 2;
			}

			if (it.isContain(state.roundWind()))
			{
				point += 2;
			}
		}
	}
}